

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.cc
# Opt level: O0

void __thiscall avro::Name::Name(Name *this,string *name)

{
  string *in_RDI;
  string *in_stack_00000018;
  Name *in_stack_00000020;
  
  std::__cxx11::string::string(in_RDI);
  std::__cxx11::string::string(in_RDI + 0x20);
  fullname(in_stack_00000020,in_stack_00000018);
  return;
}

Assistant:

Name::Name(const std::string& name)
{
    fullname(name);
}